

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void __thiscall CSnapIDPool::FreeID(CSnapIDPool *this,int ID)

{
  int64 iVar1;
  int64 iVar2;
  
  if (-1 < ID) {
    dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/server/server.cpp"
                   ,0x6f,(uint)(this->m_aIDs[(uint)ID].m_State == 1),"id is not allocated");
    this->m_InUsage = this->m_InUsage + -1;
    this->m_aIDs[(uint)ID].m_State = 2;
    iVar1 = time_get();
    iVar2 = time_freq();
    this->m_aIDs[(uint)ID].m_Timeout = (int)iVar1 + (int)iVar2 * 5;
    this->m_aIDs[(uint)ID].m_Next = -1;
    if ((long)this->m_LastTimed == -1) {
      this->m_FirstTimed = ID;
    }
    else {
      this->m_aIDs[this->m_LastTimed].m_Next = (short)ID;
    }
    this->m_LastTimed = ID;
  }
  return;
}

Assistant:

void CSnapIDPool::FreeID(int ID)
{
	if(ID < 0)
		return;
	dbg_assert(m_aIDs[ID].m_State == 1, "id is not allocated");

	m_InUsage--;
	m_aIDs[ID].m_State = 2;
	m_aIDs[ID].m_Timeout = time_get()+time_freq()*5;
	m_aIDs[ID].m_Next = -1;

	if(m_LastTimed != -1)
	{
		m_aIDs[m_LastTimed].m_Next = ID;
		m_LastTimed = ID;
	}
	else
	{
		m_FirstTimed = ID;
		m_LastTimed = ID;
	}
}